

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O2

void __thiscall OpenMD::HBondRvol::writeDensityR(HBondRvol *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  ofstream qRstream;
  DumpReader reader;
  
  DumpReader::DumpReader
            (&reader,(this->super_StaticAnalyser).info_,&(this->super_StaticAnalyser).dumpFilename_)
  ;
  iVar2 = DumpReader::getNFrames(&reader);
  std::ofstream::ofstream
            (&qRstream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"HBondRvol: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar4 = std::operator<<((ostream *)&qRstream,"# ");
    poVar4 = std::operator<<(poVar4,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&qRstream,"#selection 1: (");
    poVar4 = std::operator<<(poVar4,(string *)&this->selectionScript1_);
    std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<((ostream *)&qRstream,"#selection 2: (");
    poVar4 = std::operator<<(poVar4,(string *)&this->selectionScript2_);
    std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<((ostream *)&qRstream,"#selection 3: (");
    poVar4 = std::operator<<(poVar4,(string *)&this->selectionScript3_);
    std::operator<<(poVar4,")\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&qRstream,"# parameters: ");
      poVar4 = std::operator<<(poVar4,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar4,"\n");
    }
    poVar4 = std::operator<<((ostream *)&qRstream,"#distance");
    std::operator<<(poVar4,"\tH Bonds\n");
    for (uVar5 = 0; uVar6 = (ulong)uVar5,
        uVar6 < (ulong)((long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      dVar7 = ((double)uVar6 + 0.5) * this->deltaR_;
      iVar3 = (int)(dVar7 * dVar7 * 12.566370614359172 * this->deltaR_);
      (this->binvol_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = iVar3;
      if (((this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] == 0) || (iVar3 == 0)) {
        poVar4 = std::ostream::_M_insert<double>(dVar7);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
      }
      else {
        poVar4 = std::ostream::_M_insert<double>(dVar7);
        std::operator<<(poVar4,"\t");
        poVar4 = std::ostream::_M_insert<double>
                           (((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar6] /
                            (double)(this->binvol_).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar6]) / (double)iVar2
                           );
      }
      std::operator<<(poVar4,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&qRstream);
  DumpReader::~DumpReader(&reader);
  return;
}

Assistant:

void HBondRvol::writeDensityR() {
    // compute average box length:

    double pi = acos(-1.0);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tH Bonds\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        binvol_[i]    = (4 * pi * (Rval * Rval) * deltaR_);
        if (sliceCount_[i] != 0 && binvol_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (binvol_[i]) / nFrames
                   << "\n";
        } else {
          qRstream << Rval << "\t" << 0 << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondRvol: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }